

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O1

void __thiscall QRingChunk::allocate(QRingChunk *this,qsizetype alloc)

{
  Data *pDVar1;
  QArrayData *data;
  char *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->chunk).d.size < alloc) || (pDVar1 = (this->chunk).d.d, pDVar1 == (Data *)0x0)) ||
     ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> != 1)) {
    QByteArray::QByteArray(&local_38,alloc,Uninitialized);
    data = &((this->chunk).d.d)->super_QArrayData;
    pcVar2 = (this->chunk).d.ptr;
    (this->chunk).d.d = local_38.d.d;
    (this->chunk).d.ptr = local_38.d.ptr;
    qVar3 = (this->chunk).d.size;
    (this->chunk).d.size = local_38.d.size;
    local_38.d.d = (Data *)data;
    local_38.d.ptr = pcVar2;
    local_38.d.size = qVar3;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRingChunk::allocate(qsizetype alloc)
{
    Q_ASSERT(alloc > 0 && size() == 0);

    if (chunk.size() < alloc || isShared())
        chunk = QByteArray(alloc, Qt::Uninitialized);
}